

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O1

unsigned_short __thiscall
WrittenFontCFF::EncodeGlyph(WrittenFontCFF *this,uint inGlyph,ULongVector *inCharacters)

{
  WrittenFontRepresentation *pWVar1;
  _Base_ptr p_Var2;
  pointer puVar3;
  byte bVar4;
  _Rb_tree_header *p_Var5;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_> _Var6;
  _Base_ptr p_Var7;
  ulong uVar8;
  bool bVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_GlyphEncodingInfo>_>,_bool> pVar10;
  GlyphEncodingInfo local_90;
  pair<const_unsigned_int,_GlyphEncodingInfo> local_70;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  uVar8 = (ulong)inGlyph;
  pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
  if ((pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    GlyphEncodingInfo::GlyphEncodingInfo(&local_90,0,0);
    local_70.first = 0;
    local_70.second.mEncodedCharacter = local_90.mEncodedCharacter;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
    ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                *)pWVar1,&local_70);
    if (local_70.second.mUnicodeCharacters.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.second.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.second.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.second.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.mUnicodeCharacters.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    RemoveFromFreeList(this,'\0');
    this->mAssignedPositions[0] = 0;
    this->mAssignedPositionsAvailable[0] = false;
  }
  pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
  p_Var5 = &(pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (pWVar1->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var5->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[bVar9]) {
    bVar9 = p_Var2[1]._M_color < inGlyph;
    if (!bVar9) {
      p_Var7 = p_Var2;
    }
  }
  _Var6._M_node = &p_Var5->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var5) &&
     (_Var6._M_node = p_Var7, inGlyph < p_Var7[1]._M_color)) {
    _Var6._M_node = &p_Var5->_M_header;
  }
  if ((_Rb_tree_header *)_Var6._M_node == p_Var5) {
    puVar3 = (inCharacters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar3 != (inCharacters->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start) {
      uVar8 = (ulong)(byte)puVar3[-1];
    }
    if (this->mAssignedPositionsAvailable[uVar8 & 0xff] == true) {
      RemoveFromFreeList(this,(uchar)uVar8);
    }
    else {
      bVar4 = AllocateFromFreeList(this,(uint)(uVar8 & 0xff));
      uVar8 = (ulong)bVar4;
    }
    uVar8 = uVar8 & 0xff;
    this->mAssignedPositions[uVar8] = inGlyph;
    this->mAssignedPositionsAvailable[uVar8] = false;
    pWVar1 = (this->super_AbstractWrittenFont).mANSIRepresentation;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_48,inCharacters);
    GlyphEncodingInfo::GlyphEncodingInfo(&local_90,(unsigned_short)uVar8,&local_48);
    local_70.second.mEncodedCharacter = local_90.mEncodedCharacter;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_70.second.mUnicodeCharacters.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.mUnicodeCharacters.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.mUnicodeCharacters.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_70.first = inGlyph;
    pVar10 = std::
             _Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
             ::_M_insert_unique<std::pair<unsigned_int_const,GlyphEncodingInfo>>
                       ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,GlyphEncodingInfo>,std::_Select1st<std::pair<unsigned_int_const,GlyphEncodingInfo>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,GlyphEncodingInfo>>>
                         *)pWVar1,&local_70);
    _Var6 = pVar10.first._M_node;
    if (local_70.second.mUnicodeCharacters.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.second.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.second.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.second.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_90.mUnicodeCharacters.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.mUnicodeCharacters.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.mUnicodeCharacters.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    this->mAvailablePositionsCount = this->mAvailablePositionsCount + 0xff;
  }
  return *(unsigned_short *)&_Var6._M_node[1]._M_parent;
}

Assistant:

unsigned short WrittenFontCFF::EncodeGlyph(unsigned int inGlyph,const ULongVector& inCharacters)
{
	// for the first time, add also 0,0 mapping
	if(mANSIRepresentation->mGlyphIDToEncodedChar.size() == 0)
	{
		mANSIRepresentation->mGlyphIDToEncodedChar.insert(UIntToGlyphEncodingInfoMap::value_type(0,GlyphEncodingInfo(0,0)));
		RemoveFromFreeList(0);
		mAssignedPositions[0] = 0;
		mAssignedPositionsAvailable[0] = false;
	}

	UIntToGlyphEncodingInfoMap::iterator it = mANSIRepresentation->mGlyphIDToEncodedChar.find(inGlyph);

	if(it == mANSIRepresentation->mGlyphIDToEncodedChar.end())
	{
		// as a default position, i'm grabbing the ansi bits. this should display nice charachters, when possible
		unsigned char encoding;
		if(inCharacters.size() > 0)
			encoding = (unsigned char)(inCharacters.back() & 0xff);
		else
			encoding = (unsigned char)(inGlyph & 0xff);
		if(mAssignedPositionsAvailable[encoding])
			RemoveFromFreeList(encoding);
		else
			encoding = AllocateFromFreeList(inGlyph);
		mAssignedPositions[encoding] = inGlyph;
		mAssignedPositionsAvailable[encoding] = false;
		it = mANSIRepresentation->mGlyphIDToEncodedChar.insert(
				UIntToGlyphEncodingInfoMap::value_type(inGlyph,GlyphEncodingInfo(encoding,inCharacters))).first;			
		--mAvailablePositionsCount;
	}
	return it->second.mEncodedCharacter;
}